

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QString * QDateTimePrivate::localNameAtMillis(qint64 millis,DaylightStatus dst)

{
  bool bVar1;
  QTimeZonePrivate *pQVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  R_conflict17 RVar3;
  QTimeZone sys;
  QString abbreviation;
  TransitionOptions resolve;
  R_conflict17 fake;
  ZoneState state;
  QString *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  QTimeZone *in_stack_ffffffffffffff08;
  QTimeZone *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve_00;
  QString *pQVar4;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve_01;
  undefined1 *local_80;
  Int local_74;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QFlagsStorage<QDateTimePrivate::TransitionOption> local_3c;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c.i = 0xaaaaaaaa;
  pQVar4 = in_RDI;
  local_3c.i = (Int)toTransitionOptions(0x56d27b);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x56d2b0);
  bVar1 = millisInSystemRange((qint64)in_stack_ffffffffffffff10,(qint64)in_stack_ffffffffffffff08);
  if (bVar1) {
    local_74 = local_3c.i;
    QLocalTime::localTimeAbbbreviationAt
              (CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>)
               SUB84((ulong)pQVar4 >> 0x20,0));
    QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffef8);
    QString::~QString((QString *)0x56d31d);
    bVar1 = QString::isEmpty((QString *)0x56d32a);
    if (!bVar1) {
      QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffef8);
      goto LAB_0056d524;
    }
  }
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::systemTimeZone();
  bVar1 = QTimeZone::isValid(in_stack_ffffffffffffff08);
  resolve_00.i._0_3_ = (undefined3)in_stack_ffffffffffffff1c;
  resolve_00.i._3_1_ = bVar1;
  if (bVar1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    zoneStateAtMillis(in_stack_ffffffffffffff10,(qint64)in_stack_ffffffffffffff08,
                      (TransitionOptions)resolve_00.i);
    if (((ulong)local_18 & 1) == 0) goto LAB_0056d479;
    pQVar2 = QTimeZone::Data::operator->((Data *)&local_80);
    (*pQVar2->_vptr_QTimeZonePrivate[7])(pQVar4,pQVar2,local_28 + (long)(int)puStack_20 * -1000);
  }
  else {
LAB_0056d479:
    resolve_01.i = (Int)((ulong)pQVar4 >> 0x20);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    RVar3 = millisToWithinRange(CONCAT44(resolve_00.i,in_stack_ffffffffffffff18));
    local_38 = (undefined1 *)RVar3.shifted;
    puStack_30 = (undefined1 *)CONCAT71(puStack_30._1_7_,RVar3.good);
    if (((undefined1  [16])RVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      QString::QString((QString *)0x56d50f);
    }
    else {
      QLocalTime::localTimeAbbbreviationAt
                (CONCAT17(RVar3.good,in_stack_ffffffffffffff00),(TransitionOptions)resolve_01.i);
    }
  }
  QTimeZone::~QTimeZone((QTimeZone *)0x56d524);
LAB_0056d524:
  QString::~QString((QString *)0x56d531);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QDateTimePrivate::localNameAtMillis(qint64 millis, DaylightStatus dst)
{
    const QDateTimePrivate::TransitionOptions resolve = toTransitionOptions(dst);
    QString abbreviation;
    if (millisInSystemRange(millis, MSECS_PER_DAY)) {
        abbreviation = QLocalTime::localTimeAbbbreviationAt(millis, resolve);
        if (!abbreviation.isEmpty())
            return abbreviation;
    }

    // Otherwise, outside the system range.
#if QT_CONFIG(timezone)
    // Use the system zone:
    const auto sys = QTimeZone::systemTimeZone();
    if (sys.isValid()) {
        ZoneState state = zoneStateAtMillis(sys, millis, resolve);
        if (state.valid)
            return sys.d->abbreviation(state.when - state.offset * MSECS_PER_SEC);
    }
#endif // timezone

    // Kludge
    // Use a time in the system range with the same day-of-week pattern to its year:
    auto fake = millisToWithinRange(millis);
    if (Q_LIKELY(fake.good))
        return QLocalTime::localTimeAbbbreviationAt(fake.shifted, resolve);

    // Overflow, apparently.
    return {};
}